

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<wchar_t,_jsoncons::stream_source<wchar_t>,_std::allocator<char>_>::
check_done(basic_json_reader<wchar_t,_jsoncons::stream_source<wchar_t>,_std::allocator<char>_> *this
          )

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  basic_json_reader<wchar_t,_jsoncons::stream_source<wchar_t>,_std::allocator<char>_> *in_RDI;
  basic_json_parser<wchar_t,_std::allocator<char>_> *this_00;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  error_code *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  ser_error *in_stack_ffffffffffffffd0;
  error_code local_18;
  
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  check_done(in_RDI,in_stack_ffffffffffffffb8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  this_00 = &in_RDI->parser_;
  basic_json_parser<wchar_t,_std::allocator<char>_>::line(this_00);
  basic_json_parser<wchar_t,_std::allocator<char>_>::column(this_00);
  ec_00._M_cat = local_18._M_cat;
  ec_00._M_value = local_18._M_value;
  ec_00._4_4_ = local_18._4_4_;
  ser_error::ser_error(in_stack_ffffffffffffffd0,ec_00,in_stack_ffffffffffffffc8,(size_t)in_RDI);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void check_done()
        {
            std::error_code ec;
            check_done(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }